

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRGBA.hpp
# Opt level: O1

bool deqp::gls::isEdgeTriplet(RGBA *c1,RGBA *c2,RGBA *c3,IVec3 *renderTargetThreshold)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  
  uVar1 = c1->m_value;
  uVar2 = c2->m_value;
  uVar3 = c3->m_value;
  if ((uVar1 & 0xffffff) == 0) {
    if (((uVar2 | uVar3) & 0xffffff) == 0) goto LAB_018a861f;
  }
  else if ((uVar2 & 0xffffff) != 0 && (uVar3 & 0xffffff) != 0) {
LAB_018a861f:
    bVar7 = ((uVar2 | uVar1 | uVar3) & 0xffffff) != 0;
    bVar4 = false;
    goto LAB_018a8630;
  }
  bVar4 = true;
  bVar7 = false;
LAB_018a8630:
  if (bVar7) {
    iVar5 = (uVar3 & 0xff) + (uVar1 & 0xff) + (uVar2 & 0xff) * -2;
    iVar6 = -iVar5;
    if (0 < iVar5) {
      iVar6 = iVar5;
    }
    bVar4 = true;
    if (iVar6 <= renderTargetThreshold->m_data[0] * 2) {
      iVar5 = ((uVar1 >> 8 & 0xff) - (uVar2 >> 7 & 0x1fe)) + (uVar3 >> 8 & 0xff);
      iVar6 = -iVar5;
      if (0 < iVar5) {
        iVar6 = iVar5;
      }
      if (iVar6 <= renderTargetThreshold->m_data[1] * 2) {
        iVar5 = ((uVar1 >> 0x10 & 0xff) - (uVar2 >> 0xf & 0x1fe)) + (uVar3 >> 0x10 & 0xff);
        iVar6 = -iVar5;
        if (0 < iVar5) {
          iVar6 = iVar5;
        }
        bVar4 = renderTargetThreshold->m_data[2] * 2 < iVar6;
      }
    }
  }
  return bVar4;
}

Assistant:

int			getRed					(void) const { return (int)((m_value >> (deUint32)RED_SHIFT)   & 0xFFu); }